

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

Content * __thiscall Jupiter::HTTP::Server::Directory::find(Directory *this,string_view in_name)

{
  pointer puVar1;
  Content *pCVar2;
  pointer puVar3;
  Directory *pDVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  char *__s;
  size_t sVar8;
  size_type __n;
  uint uVar9;
  size_t __n_00;
  iterator __end2;
  iterator __begin2;
  pointer puVar10;
  pointer puVar11;
  
  __s = in_name._M_str;
  __n_00 = in_name._M_len;
  if (__n_00 == 0) {
    uVar9 = 0;
  }
  else {
    pcVar6 = (char *)memchr(__s,0x2f,__n_00);
    sVar8 = (long)pcVar6 - (long)__s;
    if (sVar8 != 0xffffffffffffffff && pcVar6 != (char *)0x0) {
      uVar9 = 0;
      for (pcVar7 = __s; pcVar6 != pcVar7; pcVar7 = pcVar7 + 1) {
        uVar9 = uVar9 + (int)*pcVar7;
      }
      puVar11 = (this->directories).
                super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->directories).
               super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar11 == puVar3) {
        return (Content *)0x0;
      }
      while (((pDVar4 = (puVar11->_M_t).
                        super___uniq_ptr_impl<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Directory_*,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                        .super__Head_base<0UL,_Jupiter::HTTP::Server::Directory_*,_false>.
                        _M_head_impl, pDVar4->name_checksum != uVar9 ||
              (sVar8 != (pDVar4->name)._M_string_length)) ||
             ((pcVar6 != __s &&
              (iVar5 = bcmp(__s,(pDVar4->name)._M_dataplus._M_p,sVar8), iVar5 != 0))))) {
        puVar11 = puVar11 + 1;
        if (puVar11 == puVar3) {
          return (Content *)0x0;
        }
      }
      iVar5 = (*pDVar4->_vptr_Directory[3])(pDVar4,__n_00 - (sVar8 + 1),__s + sVar8 + 1);
      return (Content *)CONCAT44(extraout_var,iVar5);
    }
    sVar8 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + (int)__s[sVar8];
      sVar8 = sVar8 + 1;
    } while (__n_00 != sVar8);
  }
  puVar10 = (this->content).
            super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->content).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar10 == puVar1) {
      return (Content *)0x0;
    }
    pCVar2 = (puVar10->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
    if ((pCVar2->name_checksum == uVar9) && ((pCVar2->name)._M_string_length == __n_00)) {
      if (__n_00 == 0) {
        return pCVar2;
      }
      iVar5 = bcmp(__s,(pCVar2->name)._M_dataplus._M_p,__n_00);
      if (iVar5 == 0) {
        return pCVar2;
      }
    }
    puVar10 = puVar10 + 1;
  } while( true );
}

Assistant:

Jupiter::HTTP::Server::Content *Jupiter::HTTP::Server::Directory::find(std::string_view in_name) {
	std::string_view in_name_ref = in_name;
	while (!in_name_ref.empty() && in_name_ref.front() == '/') {
		in_name.remove_prefix(1);
	}

	size_t index = in_name_ref.find('/');
	if (index == std::string_view::npos) { // Search content
		unsigned int content_name_checksum = calc_checksum(in_name_ref);
		index = content.size();
		for (auto& content_item : content) {
			if (content_item->name_checksum == content_name_checksum && content_item->name == in_name_ref) {
				return content_item.get();
			}
		}
		return nullptr; // No such content
	}

	// Just use split_once?
	std::string_view dir_name(in_name_ref.data(), index);
	in_name_ref.remove_prefix(dir_name.size() + 1);
	unsigned int dir_name_checksum = calc_checksum(dir_name);

	for (auto& directory : directories) {
		if (directory->name_checksum == dir_name_checksum && directory->name == dir_name) {
			return directory->find(in_name_ref);
		}
	}

	return nullptr; // No such directory
}